

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringpiece.cc
# Opt level: O1

bool __thiscall
google::protobuf::stringpiece_internal::StringPiece::Consume(StringPiece *this,StringPiece x)

{
  ulong uVar1;
  int iVar2;
  ulong __n;
  bool bVar3;
  
  __n = x.length_;
  uVar1 = this->length_;
  if (uVar1 < __n) {
    bVar3 = false;
  }
  else {
    iVar2 = bcmp(this->ptr_,x.ptr_,__n);
    bVar3 = iVar2 == 0;
  }
  if (bVar3 != false) {
    this->ptr_ = this->ptr_ + __n;
    this->length_ = uVar1 - __n;
  }
  return bVar3;
}

Assistant:

bool StringPiece::Consume(StringPiece x) {
  if (starts_with(x)) {
    ptr_ += x.length_;
    length_ -= x.length_;
    return true;
  }
  return false;
}